

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O3

void __thiscall Js::JavascriptGenerator::Finalize(JavascriptGenerator *this,bool isShutdown)

{
  InterpreterStackFrame *address;
  Recycler *this_00;
  Type address_00;
  
  if (DAT_015bf41e == '\x01' && !isShutdown) {
    address = (this->frame).ptr;
    this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->recycler;
    if (address != (InterpreterStackFrame *)0x0) {
      Memory::Recycler::UnRegisterPendingWriteBarrierBlock(this_00,address);
    }
    address_00 = (this->args).Values;
    if (address_00 != (Type)0x0) {
      Memory::Recycler::UnRegisterPendingWriteBarrierBlock(this_00,address_00);
      return;
    }
  }
  return;
}

Assistant:

void JavascriptGenerator::Finalize(bool isShutdown)
{
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && !isShutdown)
    {
        auto* recycler = GetScriptContext()->GetRecycler();
        
        if (this->frame)
            recycler->UnRegisterPendingWriteBarrierBlock(this->frame);

        if (this->args.Values)
            recycler->UnRegisterPendingWriteBarrierBlock(this->args.Values);
    }
}